

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::compute_pipeline_is_supported
          (Impl *this,VkComputePipelineCreateInfo *info)

{
  bool bVar1;
  VkBaseInStructure *sin;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = (int *)info->pNext;
  do {
    if (piVar2 == (int *)0x0) {
      uVar3 = (ulong)info->flags;
LAB_00110946:
      if ((uVar3 & 0xffffffbf97fbff28) == 0) {
        if (this->null_device != false) {
          return true;
        }
        if ((((((((uint)uVar3 >> 0x1d & 1) == 0) ||
               ((this->features).descriptor_buffer.descriptorBuffer != 0)) &&
              ((((uint)uVar3 >> 0x12 & 1) == 0 ||
               ((this->features).device_generated_commands_compute_nv.deviceGeneratedCompute != 0)))
              ) && (((uVar3 & 0x48000000) == 0 ||
                    ((this->features).pipeline_protected_access.pipelineProtectedAccess != 0)))) &&
            (((uVar3 & 0x10) == 0 || (0x400fff < this->api_version)))) &&
           ((uVar3 >> 0x26 == 0 ||
            ((this->features).device_generated_commands.deviceGeneratedCommands != 0)))) {
          bVar1 = subgroup_size_control_is_supported(this,&info->stage);
          if ((bVar1) && (bVar1 = stage_limits_are_supported(this,&info->stage), bVar1)) {
            bVar1 = pnext_chain_is_supported(this,info->pNext);
            return bVar1;
          }
        }
      }
      return false;
    }
    if (*piVar2 == 0x3ba1f5f5) {
      uVar3 = *(ulong *)(piVar2 + 4);
      goto LAB_00110946;
    }
    piVar2 = *(int **)(piVar2 + 2);
  } while( true );
}

Assistant:

bool FeatureFilter::Impl::compute_pipeline_is_supported(const VkComputePipelineCreateInfo *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkPipelineCreateFlags2KHR supported_flags =
			VK_PIPELINE_CREATE_DISABLE_OPTIMIZATION_BIT |
			VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT |
			VK_PIPELINE_CREATE_DERIVATIVE_BIT |
			VK_PIPELINE_CREATE_DISPATCH_BASE_BIT |
			VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR |
			VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_PIPELINE_CREATE_INDIRECT_BINDABLE_BIT_NV |
			VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
			VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT |
			VK_PIPELINE_CREATE_2_INDIRECT_BINDABLE_BIT_EXT;

	auto flags = get_effective_flags(info);

	if ((flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((flags & VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT) != 0)
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

	if ((flags & VK_PIPELINE_CREATE_INDIRECT_BINDABLE_BIT_NV) != 0 &&
	    features.device_generated_commands_compute_nv.deviceGeneratedCompute == VK_FALSE)
		return false;

	if ((flags & (VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
	              VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT)) != 0 &&
	    features.pipeline_protected_access.pipelineProtectedAccess == VK_FALSE)
		return false;

	if ((flags & VK_PIPELINE_CREATE_DISPATCH_BASE_BIT) != 0 &&
	    api_version < VK_API_VERSION_1_1)
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_2_INDIRECT_BINDABLE_BIT_EXT) != 0 &&
	    features.device_generated_commands.deviceGeneratedCommands == VK_FALSE)
		return false;

	if (!subgroup_size_control_is_supported(info->stage))
		return false;

	if (!stage_limits_are_supported(info->stage))
		return false;

	return pnext_chain_is_supported(info->pNext);
}